

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3TermSelect(Fts3Table *p,Fts3PhraseToken *pTok,int iColumn,int *pnOut,char **ppOut)

{
  long lVar1;
  int nDoclist;
  Fts3Table *in_RCX;
  undefined4 in_EDX;
  long in_RSI;
  TermSelect *in_R8;
  long in_FS_OFFSET;
  bool bVar2;
  int i;
  Fts3MultiSegReader *pSegcsr;
  int rc;
  Fts3SegFilter filter;
  TermSelect tsc;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar3;
  undefined4 in_stack_ffffffffffffff08;
  char *local_c8 [7];
  Fts3MultiSegReader *in_stack_ffffffffffffff70;
  Fts3Table *in_stack_ffffffffffffff78;
  undefined4 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_c8,0xaa,0xc0);
  memset(local_c8,0,0xc0);
  nDoclist = sqlite3Fts3SegReaderStart
                       ((Fts3Table *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (Fts3MultiSegReader *)
                        CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                        (Fts3SegFilter *)0x24e2f0);
  while( true ) {
    bVar2 = false;
    if (nDoclist == 0) {
      nDoclist = sqlite3Fts3SegReaderStep(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      bVar2 = nDoclist == 100;
    }
    if (!bVar2) break;
    nDoclist = fts3TermSelectMerge((Fts3Table *)CONCAT44(in_EDX,in_stack_ffffffffffffff08),
                                   (TermSelect *)in_RCX,(char *)in_R8,nDoclist);
  }
  if (nDoclist == 0) {
    nDoclist = fts3TermSelectFinishMerge(in_RCX,in_R8);
  }
  if (nDoclist == 0) {
    in_R8->aaOutput[0] = local_c8[0];
    *(undefined4 *)&(in_RCX->base).pModule = local_48;
  }
  else {
    for (iVar3 = 0; iVar3 < 0x10; iVar3 = iVar3 + 1) {
      sqlite3_free((void *)0x24e3b9);
    }
  }
  fts3SegReaderCursorFree((Fts3MultiSegReader *)0x24e3d2);
  *(undefined8 *)(in_RSI + 0x20) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return nDoclist;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3TermSelect(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3PhraseToken *pTok,          /* Token to query for */
  int iColumn,                    /* Column to query (or -ve for all columns) */
  int *pnOut,                     /* OUT: Size of buffer at *ppOut */
  char **ppOut                    /* OUT: Malloced result buffer */
){
  int rc;                         /* Return code */
  Fts3MultiSegReader *pSegcsr;    /* Seg-reader cursor for this term */
  TermSelect tsc;                 /* Object for pair-wise doclist merging */
  Fts3SegFilter filter;           /* Segment term filter configuration */

  pSegcsr = pTok->pSegcsr;
  memset(&tsc, 0, sizeof(TermSelect));

  filter.flags = FTS3_SEGMENT_IGNORE_EMPTY | FTS3_SEGMENT_REQUIRE_POS
        | (pTok->isPrefix ? FTS3_SEGMENT_PREFIX : 0)
        | (pTok->bFirst ? FTS3_SEGMENT_FIRST : 0)
        | (iColumn<p->nColumn ? FTS3_SEGMENT_COLUMN_FILTER : 0);
  filter.iCol = iColumn;
  filter.zTerm = pTok->z;
  filter.nTerm = pTok->n;

  rc = sqlite3Fts3SegReaderStart(p, pSegcsr, &filter);
  while( SQLITE_OK==rc
      && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pSegcsr))
  ){
    rc = fts3TermSelectMerge(p, &tsc, pSegcsr->aDoclist, pSegcsr->nDoclist);
  }

  if( rc==SQLITE_OK ){
    rc = fts3TermSelectFinishMerge(p, &tsc);
  }
  if( rc==SQLITE_OK ){
    *ppOut = tsc.aaOutput[0];
    *pnOut = tsc.anOutput[0];
  }else{
    int i;
    for(i=0; i<SizeofArray(tsc.aaOutput); i++){
      sqlite3_free(tsc.aaOutput[i]);
    }
  }

  fts3SegReaderCursorFree(pSegcsr);
  pTok->pSegcsr = 0;
  return rc;
}